

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

size_t HTS_fread_big_endian(void *buf,size_t size,size_t n,HTS_File *fp)

{
  undefined1 uVar1;
  size_t sVar2;
  undefined1 *puVar3;
  size_t sVar4;
  undefined1 *puVar5;
  ulong uVar6;
  char *q;
  
  sVar2 = HTS_fread(buf,size,n,fp);
  puVar3 = (undefined1 *)((long)buf + (size - 1));
  for (sVar4 = 0; sVar4 != sVar2; sVar4 = sVar4 + 1) {
    puVar5 = puVar3;
    for (uVar6 = 0; size >> 1 != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = *(undefined1 *)((long)buf + uVar6);
      *(undefined1 *)((long)buf + uVar6) = *puVar5;
      *puVar5 = uVar1;
      puVar5 = puVar5 + -1;
    }
    buf = (void *)((long)buf + size);
    puVar3 = puVar3 + size;
  }
  return sVar2;
}

Assistant:

size_t HTS_fread_big_endian(void *buf, size_t size, size_t n, HTS_File * fp)
{
   size_t block = HTS_fread(buf, size, n, fp);

#ifdef WORDS_LITTLEENDIAN
   HTS_byte_swap(buf, size, block);
#endif                          /* WORDS_LITTLEENDIAN */

   return block;
}